

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O0

void __thiscall
boost::unordered::detail::foa::
table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
::increment(void *param_1)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  uint n;
  int mask;
  undefined4 in_stack_ffffffffffffffd8;
  
  while( true ) {
    *(long *)(((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 8) =
         *(long *)(((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 8) +
         0x18;
    puVar4 = pc((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                 *)0x276609);
    if (((ulong)puVar4 & 0xf) == 0xe) break;
    *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m =
         *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 1;
    pc((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        *)0x276638);
    bVar1 = group15<boost::unordered::detail::foa::plain_integral>::is_occupied((uchar *)param_1);
    if (bVar1) {
      puVar4 = pc((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)0x276650);
      bVar1 = group15<boost::unordered::detail::foa::plain_integral>::is_sentinel(puVar4);
      if (bVar1) {
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[8] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[9] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[10] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xb] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xc] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xd] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xe] = '\0';
        ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xf] = '\0';
      }
      return;
    }
  }
  *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m =
       *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 2;
  while( true ) {
    pc((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
        *)0x27667c);
    iVar2 = group15<boost::unordered::detail::foa::plain_integral>::match_occupied
                      ((group15<boost::unordered::detail::foa::plain_integral> *)0x276684);
    if (iVar2 != 0) break;
    *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m =
         *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 0x10;
    *(long *)(((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 8) =
         *(long *)(((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 8) +
         0x168;
  }
  uVar3 = unchecked_countr_zero(0);
  pc((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      *)0x2766b0);
  bVar1 = group15<boost::unordered::detail::foa::plain_integral>::is_sentinel
                    ((group15<boost::unordered::detail::foa::plain_integral> *)param_1,
                     CONCAT44(iVar2,in_stack_ffffffffffffffd8));
  if (!bVar1) {
    *(ulong *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m =
         (ulong)uVar3 +
         *(long *)((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m;
    *(ulong *)(((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 8) =
         (ulong)uVar3 * 0x18 +
         *(long *)(((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m + 8);
    return;
  }
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[8] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[9] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[10] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xb] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xc] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xd] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xe] = '\0';
  ((group15<boost::unordered::detail::foa::plain_integral> *)param_1)->m[0xf] = '\0';
  return;
}

Assistant:

inline void increment(std::true_type /* regular layout */) noexcept {
        using diff_type = typename std::pointer_traits<char_pointer>::difference_type;

        for (;;) {
            ++p_;
            if (reinterpret_cast<uintptr_t>(pc()) % sizeof(group_type) == N - 1) {
                pc_ += static_cast<diff_type>(sizeof(group_type) - (N - 1));
                break;
            }
            ++pc_;
            if (!group_type::is_occupied(pc()))
                continue;
            if (BOOST_UNLIKELY(group_type::is_sentinel(pc())))
                p_ = nullptr;
            return;
        }

        for (;;) {
            int mask = reinterpret_cast<group_type*>(pc())->match_occupied();
            if (mask != 0) {
                auto n = unchecked_countr_zero(mask);
                if (BOOST_UNLIKELY(reinterpret_cast<group_type*>(pc())->is_sentinel(n))) {
                    p_ = nullptr;
                }
                else {
                    pc_ += static_cast<diff_type>(n);
                    p_ += static_cast<diff_type>(n);
                }
                return;
            }
            pc_ += static_cast<diff_type>(sizeof(group_type));
            p_ += static_cast<diff_type>(N);
        }
    }